

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O2

void __thiscall
cmCTestTestHandler::PrintLabelOrSubprojectSummary(cmCTestTestHandler *this,bool doSubProject)

{
  _Rb_tree_node_base *__k;
  double dVar1;
  int iVar2;
  pointer pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  pointer pcVar5;
  cmCTest *pcVar6;
  bool bVar7;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var8;
  mapped_type_conflict *pmVar9;
  mapped_type *pmVar10;
  ostream *poVar11;
  _Base_ptr p_Var12;
  cmCTestTestProperties *p;
  pointer pcVar13;
  string *l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  cmCTestTestResult *result;
  pointer pcVar15;
  ulong uVar16;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  subprojects;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  labels;
  char *local_7c0 [4];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  labelCounts;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  labelTimes;
  string label;
  ostringstream labelCountStr;
  ostringstream cmCTestLog_msg;
  ostringstream cmCTestLog_msg_2;
  
  cmCTest::GetLabelsForSubprojects_abi_cxx11_
            (&subprojects,(this->super_cmCTestGenericHandler).CTest);
  labelTimes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &labelTimes._M_t._M_impl.super__Rb_tree_header._M_header;
  labelTimes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  labelTimes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  labelTimes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  labelCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &labelCounts._M_t._M_impl.super__Rb_tree_header._M_header;
  labelCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  labelCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  labelCounts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &labels._M_t._M_impl.super__Rb_tree_header._M_header;
  labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pcVar3 = (this->TestList).
           super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar16 = 0;
  labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  labelCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       labelCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  labelTimes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       labelTimes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (pcVar13 = (this->TestList).
                 super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                 ._M_impl.super__Vector_impl_data._M_start; pcVar13 != pcVar3; pcVar13 = pcVar13 + 1
      ) {
    pbVar4 = (pcVar13->Labels).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar14 = (pcVar13->Labels).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar14 != pbVar4;
        pbVar14 = pbVar14 + 1) {
      _Var8 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        (subprojects.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         subprojects.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,pbVar14);
      if ((_Var8._M_current !=
          subprojects.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) == doSubProject) {
        if (uVar16 < pbVar14->_M_string_length) {
          uVar16 = pbVar14->_M_string_length;
        }
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&labels,pbVar14);
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                 ::operator[](&labelTimes,pbVar14);
        *pmVar9 = 0.0;
        pmVar10 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::operator[](&labelCounts,pbVar14);
        *pmVar10 = 0;
      }
    }
  }
  pcVar5 = (this->TestResults).
           super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pcVar15 = (this->TestResults).
                 super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                 ._M_impl.super__Vector_impl_data._M_start; pcVar15 != pcVar5; pcVar15 = pcVar15 + 1
      ) {
    pbVar4 = (pcVar15->Properties->Labels).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar14 = (pcVar15->Properties->Labels).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar14 != pbVar4;
        pbVar14 = pbVar14 + 1) {
      bVar7 = ::cm::
              contains<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&labels,pbVar14);
      if (bVar7) {
        dVar1 = (pcVar15->ExecutionTime).__r;
        iVar2 = pcVar15->Properties->Processors;
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                 ::operator[](&labelTimes,pbVar14);
        *pmVar9 = dVar1 * (double)iVar2 + *pmVar9;
        pmVar10 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::operator[](&labelCounts,pbVar14);
        *pmVar10 = *pmVar10 + 1;
      }
    }
  }
  if (labels._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    if (doSubProject) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      std::operator<<((ostream *)&cmCTestLog_msg,"\nSubproject Time Summary:");
      pcVar6 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar6,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,0x304,_labelCountStr,(this->super_cmCTestGenericHandler).Quiet);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      std::operator<<((ostream *)&cmCTestLog_msg,"\nLabel Time Summary:");
      pcVar6 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar6,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,0x307,_labelCountStr,(this->super_cmCTestGenericHandler).Quiet);
    }
    std::__cxx11::string::~string((string *)&labelCountStr);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    for (p_Var12 = labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var12 != &labels._M_t._M_impl.super__Rb_tree_header;
        p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12)) {
      __k = p_Var12 + 1;
      std::__cxx11::string::string((string *)&label,(string *)__k);
      std::__cxx11::string::resize((ulong)&label,(char)uVar16 + '\x03');
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
               ::operator[](&labelTimes,(key_type *)__k);
      snprintf((char *)&cmCTestLog_msg,0x400,"%6.2f sec*proc",*pmVar9);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&labelCountStr);
      poVar11 = std::operator<<((ostream *)&labelCountStr,"(");
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::operator[](&labelCounts,(key_type *)__k);
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,*pmVar10);
      std::operator<<(poVar11," test");
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::operator[](&labelCounts,(key_type *)__k);
      if (1 < *pmVar10) {
        std::operator<<((ostream *)&labelCountStr,"s");
      }
      std::operator<<((ostream *)&labelCountStr,")");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_2);
      poVar11 = std::operator<<((ostream *)&cmCTestLog_msg_2,"\n");
      poVar11 = std::operator<<(poVar11,(string *)&label);
      poVar11 = std::operator<<(poVar11," = ");
      poVar11 = std::operator<<(poVar11,(char *)&cmCTestLog_msg);
      poVar11 = std::operator<<(poVar11," ");
      std::__cxx11::stringbuf::str();
      std::operator<<(poVar11,(string *)local_7c0);
      std::__cxx11::string::~string((string *)local_7c0);
      pcVar6 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar6,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,0x31a,local_7c0[0],(this->super_cmCTestGenericHandler).Quiet);
      std::__cxx11::string::~string((string *)local_7c0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_2);
      if (this->LogFile != (ostream *)0x0) {
        poVar11 = std::operator<<(this->LogFile,"\n");
        poVar11 = std::operator<<(poVar11,(string *)__k);
        poVar11 = std::operator<<(poVar11," = ");
        poVar11 = std::operator<<(poVar11,(char *)&cmCTestLog_msg);
        std::operator<<(poVar11,"\n");
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&labelCountStr);
      std::__cxx11::string::~string((string *)&label);
    }
    if (this->LogFile != (ostream *)0x0) {
      std::operator<<(this->LogFile,"\n");
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    std::operator<<((ostream *)&cmCTestLog_msg,"\n");
    pcVar6 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar6,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                 ,0x322,_labelCountStr,(this->super_cmCTestGenericHandler).Quiet);
    std::__cxx11::string::~string((string *)&labelCountStr);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&labels._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&labelCounts._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~_Rb_tree(&labelTimes._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&subprojects);
  return;
}

Assistant:

void cmCTestTestHandler::PrintLabelOrSubprojectSummary(bool doSubProject)
{
  // collect subproject labels
  std::vector<std::string> subprojects =
    this->CTest->GetLabelsForSubprojects();
  std::map<std::string, double> labelTimes;
  std::map<std::string, int> labelCounts;
  std::set<std::string> labels;
  std::string::size_type maxlen = 0;
  // initialize maps
  for (cmCTestTestProperties& p : this->TestList) {
    for (std::string const& l : p.Labels) {
      // first check to see if the current label is a subproject label
      bool isSubprojectLabel = false;
      auto subproject = std::find(subprojects.begin(), subprojects.end(), l);
      if (subproject != subprojects.end()) {
        isSubprojectLabel = true;
      }
      // if we are doing sub projects and this label is one, then use it
      // if we are not doing sub projects and the label is not one use it
      if (doSubProject == isSubprojectLabel) {
        if (l.size() > maxlen) {
          maxlen = l.size();
        }
        labels.insert(l);
        labelTimes[l] = 0;
        labelCounts[l] = 0;
      }
    }
  }
  // fill maps
  for (cmCTestTestResult& result : this->TestResults) {
    cmCTestTestProperties& p = *result.Properties;
    for (std::string const& l : p.Labels) {
      // only use labels found in labels
      if (cm::contains(labels, l)) {
        labelTimes[l] +=
          result.ExecutionTime.count() * result.Properties->Processors;
        ++labelCounts[l];
      }
    }
  }
  // if no labels are found return and print nothing
  if (labels.empty()) {
    return;
  }
  // now print times
  if (doSubProject) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "\nSubproject Time Summary:", this->Quiet);
  } else {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "\nLabel Time Summary:", this->Quiet);
  }
  for (std::string const& i : labels) {
    std::string label = i;
    label.resize(maxlen + 3, ' ');

    char buf[1024];
    snprintf(buf, sizeof(buf), "%6.2f sec*proc", labelTimes[i]);

    std::ostringstream labelCountStr;
    labelCountStr << "(" << labelCounts[i] << " test";
    if (labelCounts[i] > 1) {
      labelCountStr << "s";
    }
    labelCountStr << ")";
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "\n"
                         << label << " = " << buf << " "
                         << labelCountStr.str(),
                       this->Quiet);
    if (this->LogFile) {
      *this->LogFile << "\n" << i << " = " << buf << "\n";
    }
  }
  if (this->LogFile) {
    *this->LogFile << "\n";
  }
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "\n", this->Quiet);
}